

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_read_utf8_char(sexp ctx,sexp port,int i)

{
  long lVar1;
  sexp psVar2;
  uint in_EDX;
  long in_RSI;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp in_stack_00000018;
  char *in_stack_00000020;
  sexp in_stack_00000028;
  sexp in_stack_00000030;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_28;
  uint local_24;
  uint local_1c;
  
  local_1c = in_EDX;
  if (0x7f < (int)in_EDX) {
    if (((int)in_EDX < 0xc0) || (0xf7 < (int)in_EDX)) {
      psVar2 = sexp_user_exception(in_stack_00000030,in_stack_00000028,in_stack_00000020,
                                   in_stack_00000018);
      return psVar2;
    }
    if ((int)in_EDX < 0xe0) {
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_28 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_24 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_24 = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_28 = local_24;
      }
      local_1c = (in_EDX & 0x3f) * 0x40 + (local_28 & 0x3f);
    }
    else if ((int)in_EDX < 0xf0) {
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_34 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_30 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_30 = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_34 = local_30;
      }
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_3c = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_38 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_38 = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_3c = local_38;
      }
      local_1c = (local_3c & 0x3f) + (in_EDX & 0x1f) * 0x1000 + (local_34 & 0x3f) * 0x40;
    }
    else {
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_48 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_44 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_44 = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_48 = local_44;
      }
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_50 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_4c = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_4c = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_50 = local_4c;
      }
      if (*(long *)(in_RSI + 0x28) == 0) {
        local_58 = getc(*(FILE **)(in_RSI + 0x20));
      }
      else {
        if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
          lVar1 = *(long *)(in_RSI + 0x38);
          *(long *)(in_RSI + 0x38) = lVar1 + 1;
          local_54 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
        }
        else {
          local_54 = sexp_buffered_read_char(in_stack_00000008,unaff_retaddr);
        }
        local_58 = local_54;
      }
      local_1c = (local_58 & 0x3f) +
                 (local_50 & 0x3f) * 0x40 + (in_EDX & 0xf) * 0x40000 + (local_48 & 0x3f) * 0x1000;
    }
  }
  return (sexp)((long)(int)local_1c * 0x100 + 0x1e);
}

Assistant:

sexp sexp_read_utf8_char (sexp ctx, sexp port, int i) {
  if (i >= 0x80) {
    if ((i < 0xC0) || (i > 0xF7)) {
      return sexp_user_exception(ctx, NULL, "read-char: invalid utf8 byte", sexp_make_fixnum(i));
    } else if (i < 0xE0) {
      i = ((i&0x3F)<<6) + (sexp_read_char(ctx, port)&0x3F);
    } else if (i < 0xF0) {
      i = ((i&0x1F)<<12) + ((sexp_read_char(ctx, port)&0x3F)<<6);
      i += sexp_read_char(ctx, port)&0x3F;
    } else {
      i = ((i&0x0F)<<18) + ((sexp_read_char(ctx, port)&0x3F)<<12);
      i += (sexp_read_char(ctx, port)&0x3F)<<6;
      i += sexp_read_char(ctx, port)&0x3F;
    }
  }
  return sexp_make_character(i);
}